

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP3Deserializer.cpp
# Opt level: O0

void __thiscall adios2::format::BP3Deserializer::BP3Deserializer(BP3Deserializer *this,Comm *comm)

{
  Comm *in_RSI;
  BP3Base *in_RDI;
  Comm *in_stack_00000048;
  BPBase *in_stack_00000050;
  Minifooter *in_stack_ffffffffffffffe0;
  
  BPBase::BPBase(in_stack_00000050,in_stack_00000048);
  BP3Base::BP3Base(in_RDI,&PTR_construction_vtable_40__0112db50,in_RSI);
  in_RDI->_vptr_BP3Base = (_func_int **)0x112dae8;
  in_RDI->_vptr_BP3Base = (_func_int **)0x112dae8;
  *(undefined8 *)&in_RDI->field_0x88 = 0x112db20;
  BPBase::Minifooter::Minifooter(in_stack_ffffffffffffffe0,(int8_t)((ulong)in_RDI >> 0x38));
  in_RDI->field_0x50 = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::helper::SubFileInfo,_std::allocator<adios2::helper::SubFileInfo>_>_>_>_>_>_>_>_>_>_>
         *)0xb73147);
  return;
}

Assistant:

BP3Deserializer::BP3Deserializer(helper::Comm const &comm)
: BPBase(comm), BP3Base(comm), m_Minifooter(3)
{
}